

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O2

ActivationReLU * __thiscall
CoreML::Specification::ActivationParams::mutable_relu(ActivationParams *this)

{
  ActivationLinear *this_00;
  
  if (this->_oneof_case_[0] == 10) {
    this_00 = (this->NonlinearityType_).linear_;
  }
  else {
    clear_NonlinearityType(this);
    this->_oneof_case_[0] = 10;
    this_00 = (ActivationLinear *)operator_new(0x18);
    ActivationReLU::ActivationReLU((ActivationReLU *)this_00);
    (this->NonlinearityType_).relu_ = (ActivationReLU *)this_00;
  }
  return (ActivationReLU *)this_00;
}

Assistant:

inline ::CoreML::Specification::ActivationReLU* ActivationParams::mutable_relu() {
  if (!has_relu()) {
    clear_NonlinearityType();
    set_has_relu();
    NonlinearityType_.relu_ = new ::CoreML::Specification::ActivationReLU;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.ActivationParams.ReLU)
  return NonlinearityType_.relu_;
}